

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.c
# Opt level: O0

void decStatus(decNumber_conflict *dn,uint32_t status,decContext *set)

{
  decContext *set_local;
  uint32_t status_local;
  decNumber_conflict *dn_local;
  
  set_local._4_4_ = status;
  if ((status & 0xdd) != 0) {
    if ((status & 0x40000000) == 0) {
      decNumberZero(dn);
      dn->bits = ' ';
    }
    else {
      set_local._4_4_ = status & 0xbfffffff;
    }
  }
  decContextSetStatus(set,set_local._4_4_);
  return;
}

Assistant:

static void decStatus(decNumber *dn, uInt status, decContext *set) {
  if (status & DEC_NaNs) {		/* error status -> NaN */
    /* if cause was an sNaN, clear and propagate [NaN is already set up] */
    if (status & DEC_sNaN) status&=~DEC_sNaN;
     else {
      decNumberZero(dn);		/* other error: clean throughout */
      dn->bits=DECNAN;			/* and make a quiet NaN */
      }
    }
  decContextSetStatus(set, status);	/* [may not return] */
  return;
  }